

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextGLImpl::DispatchComputeIndirect
          (DeviceContextGLImpl *this,DispatchComputeIndirectAttribs *Attribs)

{
  GLContextState *State;
  IBuffer *pSrcPtr;
  uint BindSRBMask;
  GLenum err;
  string msg;
  uint local_54;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DispatchComputeIndirect
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  State = &this->m_ContextState;
  PipelineStateGLImpl::CommitProgram
            ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
             m_pObject,State);
  DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::DvpVerifyCacheRevisions
            (&(this->m_BindInfo).super_CommittedShaderResources);
  BindSRBMask = (uint)((this->m_BindInfo).super_CommittedShaderResources.ActiveSRBMask &
                      ((this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask |
                      (this->m_BindInfo).super_CommittedShaderResources.DynamicSRBMask));
  if (BindSRBMask != 0) {
    BindProgramResources(this,BindSRBMask);
  }
  DvpValidateCommittedShaderResources(this);
  pSrcPtr = Attribs->pAttribsBuffer;
  if (pSrcPtr != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferGLImpl,Diligent::IBuffer>(pSrcPtr);
  }
  GLContextState::EnsureMemoryBarrier
            (State,MEMORY_BARRIER_INDIRECT_BUFFER,(AsyncWritableResource *)(pSrcPtr + 0x11));
  GLContextState::BindBuffer
            (State,0x90ee,
             (GLBufferObj *)
             ((long)&pSrcPtr[0x11].super_IDeviceObject.super_IObject._vptr_IObject + 4),false);
  local_54 = glGetError();
  if (local_54 != 0) {
    LogError<false,char[54],char[17],unsigned_int>
              (false,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57b,(char (*) [54])"Failed to bind a buffer for dispatch indirect command",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>((string *)local_50,(char (*) [6])0x32952e);
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ != &local_40) {
      operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
    }
  }
  (*__glewDispatchComputeIndirect)(Attribs->DispatchArgsByteOffset);
  local_54 = glGetError();
  if (local_54 != 0) {
    LogError<false,char[35],char[17],unsigned_int>
              (false,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57e,(char (*) [35])"glDispatchComputeIndirect() failed",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>((string *)local_50,(char (*) [6])0x32952e);
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ != &local_40) {
      operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
    }
  }
  local_50._0_8_ = (pointer)0x0;
  local_50._8_4_ = 0;
  GLContextState::BindBuffer(State,0x90ee,(GLBufferObj *)local_50,false);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)local_50);
  GLContextState::SetPendingMemoryBarriers(State,this->m_CommittedResourcesTentativeBarriers);
  this->m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;
  return;
}

Assistant:

void DeviceContextGLImpl::DispatchComputeIndirect(const DispatchComputeIndirectAttribs& Attribs)
{
    TDeviceContextBase::DispatchComputeIndirect(Attribs, 0);

#if GL_ARB_compute_shader
    // The program might have changed since the last SetPipelineState call if a shader was
    // created after the call (ShaderResourcesGL needs to bind a program to load uniforms).
    m_pPipelineState->CommitProgram(m_ContextState);
    if (Uint32 BindSRBMask = m_BindInfo.GetCommitMask())
    {
        BindProgramResources(BindSRBMask);
    }

#    ifdef DILIGENT_DEVELOPMENT
    // Must be called after BindProgramResources as it needs BaseBindings
    DvpValidateCommittedShaderResources();
#    endif

    BufferGLImpl* pBufferGL = ClassPtrCast<BufferGLImpl>(Attribs.pAttribsBuffer);
    pBufferGL->BufferMemoryBarrier(
        MEMORY_BARRIER_INDIRECT_BUFFER, // Command data sourced from buffer objects by
                                        // Draw*Indirect and DispatchComputeIndirect commands after the barrier
                                        // will reflect data written by shaders prior to the barrier.The buffer
                                        // objects affected by this bit are derived from the DRAW_INDIRECT_BUFFER
                                        // and DISPATCH_INDIRECT_BUFFER bindings.
        m_ContextState);

    constexpr bool ResetVAO = false; // GL_DISPATCH_INDIRECT_BUFFER does not affect VAO
    m_ContextState.BindBuffer(GL_DISPATCH_INDIRECT_BUFFER, pBufferGL->m_GlBuffer, ResetVAO);
    DEV_CHECK_GL_ERROR("Failed to bind a buffer for dispatch indirect command");

    glDispatchComputeIndirect(StaticCast<GLintptr>(Attribs.DispatchArgsByteOffset));
    DEV_CHECK_GL_ERROR("glDispatchComputeIndirect() failed");

    m_ContextState.BindBuffer(GL_DISPATCH_INDIRECT_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);

    PostDraw();
#else
    UNSUPPORTED("Compute shaders are not supported");
#endif
}